

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageBlock
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  Type *pTVar4;
  int32 iVar5;
  MessageOptions *pMVar6;
  int i;
  int iVar7;
  allocator local_51;
  string local_50;
  
  bVar1 = ConsumeEndOfDeclaration(this,"{",message_location);
  if (bVar1) {
    while (bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0), !bVar1) {
      if ((this->input_->current_).type == TYPE_END) {
        std::__cxx11::string::string
                  ((string *)&local_50,"Reached end of input in message definition (missing \'}\')."
                   ,&local_51);
        AddError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_002d6704;
      }
      bVar1 = ParseMessageStatement(this,message,message_location,containing_file);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    bVar1 = true;
    if (0 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
      pMVar6 = message->options_;
      if (pMVar6 == (MessageOptions *)0x0) {
        pMVar6 = (MessageOptions *)&_MessageOptions_default_instance_;
      }
      for (iVar7 = 0;
          iVar7 < (pMVar6->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
          iVar7 = iVar7 + 1) {
        pTVar2 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                           (&(pMVar6->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar7);
        if ((pTVar2->name_).super_RepeatedPtrFieldBase.current_size_ == 1) {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                             (&(pTVar2->name_).super_RepeatedPtrFieldBase,0);
          bVar1 = std::operator==((pTVar3->name_part_).ptr_,"message_set_wire_format");
          if ((bVar1) && (bVar1 = std::operator==((pTVar2->identifier_value_).ptr_,"true"), bVar1))
          {
            iVar5 = 0x7fffffff;
            goto LAB_002d671a;
          }
        }
      }
      iVar5 = 0x20000000;
LAB_002d671a:
      for (iVar7 = 0; iVar7 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_;
          iVar7 = iVar7 + 1) {
        pTVar4 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                           (&(message->extension_range_).super_RepeatedPtrFieldBase,iVar7);
        if (pTVar4->end_ == -1) {
          pTVar4 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                             (&(message->extension_range_).super_RepeatedPtrFieldBase,iVar7);
          *(byte *)(pTVar4->_has_bits_).has_bits_ = (byte)(pTVar4->_has_bits_).has_bits_[0] | 2;
          pTVar4->end_ = iVar5;
        }
      }
      bVar1 = true;
    }
  }
  else {
LAB_002d6704:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseMessageBlock(DescriptorProto* message,
                               const LocationRecorder& message_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &message_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in message definition (missing '}').");
      return false;
    }

    if (!ParseMessageStatement(message, message_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  if (message->extension_range_size() > 0) {
    AdjustExtensionRangesWithMaxEndNumber(message);
  }
  return true;
}